

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall flatbuffers::Parser::ParseHexNum(Parser *this,int nibbles,uint64_t *val)

{
  long *plVar1;
  int *piVar2;
  ulonglong uVar3;
  uint uVar4;
  ulonglong *in_RCX;
  ulong uVar5;
  long *plVar6;
  ulonglong uVar7;
  undefined4 in_register_00000034;
  string *msg;
  ulong uVar8;
  bool bVar9;
  string target;
  char *endptr;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  msg = (string *)CONCAT44(in_register_00000034,nibbles);
  if ((int)val < 1) {
    __assert_fail("nibbles > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                  ,0x1c8,"CheckedError flatbuffers::Parser::ParseHexNum(int, uint64_t *)");
  }
  uVar8 = (ulong)val & 0xffffffff;
  uVar4 = (uint)*(char *)msg->_M_string_length;
  if ((uVar4 - 0x30 < 10) || (bVar9 = true, (uVar4 & 0xffffffdf) - 0x41 < 6)) {
    uVar5 = 0;
    do {
      if (uVar8 - 1 == uVar5) goto LAB_00108b62;
      uVar4 = (uint)((char *)msg->_M_string_length)[uVar5 + 1];
      uVar5 = uVar5 + 1;
    } while ((uVar4 - 0x30 < 10) || ((uVar4 & 0xffffffdf) - 0x41 < 6));
    bVar9 = uVar5 < uVar8;
  }
  NumToString<int>(&local_50,(int)val);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1b562b);
  plVar6 = plVar1 + 2;
  if ((long *)*plVar1 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar6 = plVar1 + 2;
  if ((long *)*plVar1 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  Error(this,msg);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (!bVar9) {
LAB_00108b62:
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,msg->_M_string_length,msg->_M_string_length + uVar8);
    plVar1 = local_90;
    if (local_90 == (long *)0x0) {
      __assert_fail("str",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                    ,0x11f,
                    "bool flatbuffers::StringToIntegerImpl(T *, const char *const, const int, const bool) [T = unsigned long]"
                   );
    }
    piVar2 = __errno_location();
    *piVar2 = 0;
    local_70 = plVar1;
    uVar3 = strtoull_l((char *)plVar1,(char **)&local_70,0x10,ClassicLocale::instance_);
    uVar7 = 0;
    if (((local_70 != plVar1) && ((char)*local_70 == '\0')) && (uVar7 = 0, *piVar2 == 0)) {
      uVar7 = uVar3;
    }
    *in_RCX = uVar7;
    msg->_M_string_length = msg->_M_string_length + uVar8;
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseHexNum(int nibbles, uint64_t *val) {
  FLATBUFFERS_ASSERT(nibbles > 0);
  for (int i = 0; i < nibbles; i++)
    if (!is_xdigit(cursor_[i]))
      return Error("escape code must be followed by " + NumToString(nibbles) +
                   " hex digits");
  std::string target(cursor_, cursor_ + nibbles);
  *val = StringToUInt(target.c_str(), 16);
  cursor_ += nibbles;
  return NoError();
}